

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

void __thiscall VGMPlayer::InitDevices(VGMPlayer *this)

{
  RESMPL_STATE *CAA;
  INT16 *pIVar1;
  QSOUND_WORK *pQVar2;
  UINT16 *pUVar3;
  pointer *ppCVar4;
  byte bVar5;
  DEVFUNC_OPTMASK p_Var6;
  iterator __position;
  undefined8 uVar7;
  DEVFUNC_SETLOGCB p_Var8;
  VGM_BASEDEV *pVVar9;
  UINT8 UVar10;
  UINT16 UVar11;
  uint uVar12;
  UINT32 UVar13;
  PLR_DEV_OPTS *pPVar14;
  undefined8 *puVar15;
  char *pcVar16;
  size_t sVar17;
  byte bVar18;
  DEV_GEN_CFG *pDVar19;
  SN76496_CFG *snCfg;
  long lVar20;
  ulong uVar21;
  UINT8 UVar22;
  VGMPlayer *this_00;
  DEVFUNC_WRITE_A16D16 *pp_Var23;
  DEVFUNC_WRITE_BLOCK *retFuncPtr;
  VGM_BASEDEV *clDev;
  CHIP_DEVICE *pCVar24;
  pointer pCVar25;
  pointer pSVar26;
  pointer pCVar27;
  PLR_DEV_OPTS *pPVar28;
  pointer devInf;
  bool bVar29;
  char postFix [16];
  string devName;
  CHIP_DEVICE local_188;
  DEV_GEN_CFG *local_98;
  PLR_DEV_OPTS *local_90;
  vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>> *local_88;
  size_t (*local_80) [2];
  VGMPlayer *local_78;
  pointer local_70;
  CHIP_DEVICE *local_68;
  QSOUND_WORK *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  value_type local_50;
  
  memset(this->_shownCmdWarnings,0,0x100);
  pCVar27 = (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar27) {
    (this->_devices).
    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar27;
  }
  local_58 = &this->_devNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_58,(this->_devNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_80 = this->_vdDevMap;
  memset(local_80,0xff,0x2a0);
  memset(this->_optDevMap,0xff,0x2a0);
  bVar5 = this->_p2612Fix;
  bVar18 = bVar5 & 0x7e;
  if ((char)bVar5 < '\0') {
    bVar18 = bVar5 | 1;
  }
  this->_p2612Fix = bVar18;
  pSVar26 = (this->_devCfgs).
            super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devCfgs).
      super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar26) {
    local_88 = (vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>> *)
               &this->_devices;
    local_90 = (PLR_DEV_OPTS *)this->_devOptMap;
    local_60 = this->_qsWork;
    uVar21 = 0;
    do {
      bVar5 = pSVar26[uVar21].type;
      bVar18 = pSVar26[uVar21].instance;
      pDVar19 = (DEV_GEN_CFG *)
                pSVar26[uVar21].cfgData.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      memset(&local_188,0,0xf0);
      pSVar26[uVar21].deviceID = 0xffffffffffffffff;
      local_188.vgmChipType = pSVar26[uVar21].vgmChipType;
      local_188.chipType = pSVar26[uVar21].type;
      sVar17 = *(size_t *)((long)local_90->emuCore + ((ulong)bVar5 * 2 + (ulong)bVar18) * 8);
      pPVar14 = (PLR_DEV_OPTS *)0x0;
      local_188.base.defInf.dataPtr = (DEV_DATA *)0x0;
      local_188.base.linkDev = (VGM_BASEDEV *)0x0;
      pPVar28 = this->_devOpts + sVar17;
      if (sVar17 == 0xffffffffffffffff) {
        pDVar19->emuCore = 0;
        UVar10 = '\0';
      }
      else {
        pDVar19->emuCore = pPVar28->emuCore[0];
        UVar10 = pPVar28->srMode;
        pPVar14 = pPVar28;
      }
      pDVar19->srMode = UVar10;
      if ((sVar17 == 0xffffffffffffffff) || (UVar13 = pPVar14->smplRate, UVar13 == 0)) {
        UVar13 = (this->super_PlayerBase)._outSmplRate;
      }
      pDVar19->smplRate = UVar13;
      local_188.chipID = bVar18;
      local_188.optID = sVar17;
      local_188.cfgID = uVar21;
      if (0x14 < bVar5) {
        switch(bVar5) {
        case 0x1f:
          local_188.flags = 0;
          local_98 = pDVar19;
          UVar13 = GetChipClock(this,local_188.vgmChipType,bVar18);
          local_188.flags = (UINT32)((UVar13 & 0x3fffffff) < local_98->clock);
          if (local_98->emuCore == 0) {
            local_98->emuCore = 0x43545200;
          }
          UVar10 = SndEmu_Start(bVar5,local_98,(DEV_INFO *)&local_188);
          if (UVar10 != '\0') break;
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x02','\x12',0,&local_188.writeD16);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0,&local_188.romSize);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x80,0,&local_188.romWrite);
          pQVar2 = local_60 + bVar18;
          pQVar2->write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
          pQVar2->startAddrCache[0] = 0;
          pQVar2->startAddrCache[1] = 0;
          pQVar2->startAddrCache[2] = 0;
          pQVar2->startAddrCache[3] = 0;
          pUVar3 = local_60[bVar18].startAddrCache + 4;
          pUVar3[0] = 0;
          pUVar3[1] = 0;
          pUVar3[2] = 0;
          pUVar3[3] = 0;
          pUVar3[4] = 0;
          pUVar3[5] = 0;
          pUVar3[6] = 0;
          pUVar3[7] = 0;
          pUVar3 = local_60[bVar18].startAddrCache + 0xc;
          pUVar3[0] = 0;
          pUVar3[1] = 0;
          pUVar3[2] = 0;
          pUVar3[3] = 0;
          pUVar3[4] = 0;
          pUVar3[5] = 0;
          pUVar3[6] = 0;
          pUVar3[7] = 0;
          pUVar3 = local_60[bVar18].pitchCache + 4;
          pUVar3[0] = 0;
          pUVar3[1] = 0;
          pUVar3[2] = 0;
          pUVar3[3] = 0;
          pUVar3[4] = 0;
          pUVar3[5] = 0;
          pUVar3[6] = 0;
          pUVar3[7] = 0;
          pQVar2 = local_60 + bVar18;
          pQVar2->pitchCache[0xc] = 0;
          pQVar2->pitchCache[0xd] = 0;
          pQVar2->pitchCache[0xe] = 0;
          pQVar2->pitchCache[0xf] = 0;
          if ((local_188.base.defInf.devDef)->coreID == 0x4d414d45) {
            local_188.flags = local_188.flags & 0xfffffffe;
          }
          pQVar2 = local_60 + bVar18;
          pDVar19 = local_98;
          if (local_188.writeD16 == (DEVFUNC_WRITE_A8D16)0x0) {
            if (local_188.write8 == (DEVFUNC_WRITE_A8D8)0x0) {
              pQVar2->write = (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0;
            }
            else {
              pQVar2->write = WriteQSound_B;
            }
          }
          else {
            pQVar2->write = WriteQSound_A;
          }
          goto LAB_00117feb;
        case 0x20:
          UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 != '\0') break;
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','!',0,&local_188.writeM8);
          UVar22 = '\0';
          UVar10 = '\"';
          pp_Var23 = &local_188.writeM16;
          goto LAB_00117fc5;
        case 0x21:
          UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            UVar22 = '\x10';
            UVar10 = '!';
            UVar11 = 0;
            retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_188.writeM8;
            goto LAB_00117fe3;
          }
          break;
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x26:
          goto switchD_001179db_caseD_1;
        case 0x25:
          UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            UVar22 = '\0';
            UVar10 = '\x12';
            pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeD16;
            goto LAB_00117fc5;
          }
          break;
        case 0x27:
          UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 != '\0') break;
          UVar10 = '\"';
          pp_Var23 = &local_188.writeM16;
          goto LAB_00117fa7;
        default:
          if (bVar5 != 0x15) {
            uVar12 = 1;
            if (bVar5 == 0x80) goto LAB_00117d21;
            goto switchD_001179db_caseD_1;
          }
          UVar10 = SndEmu_Start('\x15',pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            UVar10 = '\x12';
            pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeD16;
            goto LAB_00117fa7;
          }
        }
        goto LAB_001182df;
      }
      switch(bVar5) {
      case 0:
        if (((bVar18 & 1) != 0) && (pDVar19->flags != '\0')) {
          if ((bVar18 < 2 && local_188.vgmChipType < 0x2a) &&
             (local_80[local_188.vgmChipType][0] != 0xffffffffffffffff)) {
            puVar15 = (undefined8 *)(local_80[local_188.vgmChipType][0] * 0xf0 + *(long *)local_88);
          }
          else {
            puVar15 = (undefined8 *)0x0;
          }
          if (puVar15 != (undefined8 *)0x0) {
            uVar7 = *puVar15;
            pDVar19[1].clock = (int)uVar7;
            pDVar19[1].smplRate = (int)((ulong)uVar7 >> 0x20);
            pDVar19->emuCore = *(UINT32 *)(puVar15[2] + 0x10);
          }
        }
        if (pDVar19->emuCore == 0) {
          pDVar19->emuCore = 0x4d414d45;
        }
        UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
        if (UVar10 != '\0') break;
        UVar22 = '\0';
        UVar10 = '\x11';
        UVar11 = 0;
        retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_188.write8;
        goto LAB_00117fe3;
      case 1:
      case 3:
      case 4:
      case 6:
      case 7:
        goto switchD_001179db_caseD_1;
      case 2:
        uVar12 = (uint)pDVar19->flags;
LAB_00117d21:
        local_188.flags = local_188.flags | uVar12;
switchD_001179db_caseD_1:
        UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
        if (UVar10 != '\0') break;
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
        UVar10 = '!';
        pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeM8;
LAB_00117fa7:
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0',UVar10,0,pp_Var23);
        UVar22 = '\x10';
        UVar10 = 0x81;
        pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.romSize;
LAB_00117fc5:
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,UVar22,UVar10,0,pp_Var23);
        UVar22 = '\x10';
        UVar10 = 0x80;
        UVar11 = 0;
        retFuncPtr = &local_188.romWrite;
LAB_00117fe3:
        SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,UVar22,UVar10,UVar11,retFuncPtr);
LAB_00117feb:
        pSVar26 = pSVar26 + uVar21;
        pSVar26->deviceID =
             ((long)(this->_devices).
                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_devices).
                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
        pcVar16 = SndEmu_GetDevName(bVar5,'\0',pDVar19);
        std::__cxx11::string::string((string *)&local_50,pcVar16,(allocator *)&local_78);
        UVar13 = GetHeaderChipClock(this,pSVar26->vgmChipType);
        if ((UVar13 >> 0x1e & 1) != 0) {
          snprintf((char *)&local_78,0x10," #%u",(ulong)(bVar18 + 1));
          std::__cxx11::string::append((char *)&local_50);
        }
        local_188.logCbData.chipDevID =
             ((long)(this->_devices).
                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_devices).
                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
        local_188.logCbData.player = this;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_58,&local_50);
        local_68 = &local_188;
        local_78 = this;
        local_70 = pSVar26;
        if ((local_188.base.defInf.devDef)->SetLogCB != (DEVFUNC_SETLOGCB)0x0) {
          (*(local_188.base.defInf.devDef)->SetLogCB)
                    (local_188.base.defInf.dataPtr,SndEmuLogCB,&local_188.logCbData);
        }
        SetupLinkedDevices(&local_188.base,DeviceLinkCallback,&local_78);
        if (sVar17 != 0xffffffffffffffff) {
          RefreshDevOptions(this,&local_188,pPVar14);
          pCVar24 = &local_188;
          lVar20 = 0;
          do {
            this_00 = (VGMPlayer *)(pCVar24->base).defInf.dataPtr;
            if ((this_00 != (VGMPlayer *)0x0) &&
               (p_Var6 = ((pCVar24->base).defInf.devDef)->SetMuteMask,
               p_Var6 != (DEVFUNC_OPTMASK)0x0)) {
              (*p_Var6)(this_00,*(UINT32 *)((long)(pPVar14->muteOpts).chnMute + lVar20));
            }
            pCVar24 = (CHIP_DEVICE *)(pCVar24->base).linkDev;
          } while ((pCVar24 != (CHIP_DEVICE *)0x0) &&
                  (bVar29 = lVar20 == 0, lVar20 = lVar20 + 4, bVar29));
          RefreshPanning(this_00,&local_188,&pPVar14->panOpts);
        }
        pVVar9 = local_188.base.linkDev;
        if ((((local_188.base.defInf.linkDevCount != 0) &&
             ((local_188.base.defInf.linkDevs)->devID == '\x12')) &&
            (sVar17 = DeviceID2OptionID(this,(uint)bVar18 << 0x10 | 0x80000012),
            pVVar9 != (VGM_BASEDEV *)0x0 && sVar17 != 0xffffffffffffffff)) &&
           (p_Var6 = ((pVVar9->defInf).devDef)->SetOptionBits, p_Var6 != (DEVFUNC_OPTMASK)0x0)) {
          (*p_Var6)(local_188.base.defInf.dataPtr,this->_devOpts[sVar17].coreOpts);
        }
        __position._M_current =
             (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        sVar17 = ((long)__position._M_current -
                  (long)(this->_devices).
                        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
        local_80[pSVar26->vgmChipType][bVar18] = sVar17;
        if (local_188.optID != 0xffffffffffffffff) {
          this->_optDevMap[local_188.optID] = sVar17;
        }
        if (__position._M_current ==
            (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<VGMPlayer::CHIP_DEVICE,std::allocator<VGMPlayer::CHIP_DEVICE>>::
          _M_realloc_insert<VGMPlayer::CHIP_DEVICE_const&>(local_88,__position,&local_188);
        }
        else {
          memcpy(__position._M_current,&local_188,0xf0);
          ppCVar4 = &(this->_devices).
                     super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar4 = *ppCVar4 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001182f0;
      case 5:
        if (pDVar19->emuCore == 0) {
          UVar13 = 0x4d414d45;
          if (pDVar19->flags == '\x01') {
            UVar13 = 0x47454e53;
          }
          pDVar19->emuCore = UVar13;
        }
        UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
        if (UVar10 == '\0') {
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
          UVar22 = '\x10';
          UVar10 = '!';
          pp_Var23 = (DEVFUNC_WRITE_A16D16 *)&local_188.writeM8;
          goto LAB_00117fc5;
        }
        break;
      case 8:
        UVar10 = SndEmu_Start(bVar5,pDVar19,(DEV_INFO *)&local_188);
        if (UVar10 == '\0') {
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x41,&local_188.romSize);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x80,0x41,&local_188.romWrite);
          SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x42,&local_188.romSizeB);
          UVar22 = '\x10';
          UVar10 = 0x80;
          UVar11 = 0x42;
          retFuncPtr = &local_188.romWriteB;
          goto LAB_00117fe3;
        }
        break;
      default:
        if (bVar5 == 0xd) {
          UVar10 = SndEmu_Start('\r',pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 == '\0') {
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\0','\x11',0,&local_188.write8);
            SndEmu_GetDeviceFunc(local_188.base.defInf.devDef,'\x10',0x81,0x524f,&local_188.romSize)
            ;
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x80,0x524f,&local_188.romWrite);
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x81,0x5241,&local_188.romSizeB);
            SndEmu_GetDeviceFunc
                      (local_188.base.defInf.devDef,'\x10',0x80,0x5241,&local_188.romWriteB);
            LoadOPL4ROM(this,&local_188);
            goto LAB_00117feb;
          }
        }
        else {
          if (bVar5 != 0x11) goto switchD_001179db_caseD_1;
          UVar10 = SndEmu_Start('\x11',pDVar19,(DEV_INFO *)&local_188);
          if (UVar10 == '\0') {
            UVar22 = '\0';
            UVar10 = '\x12';
            UVar11 = 0;
            retFuncPtr = (DEVFUNC_WRITE_BLOCK *)&local_188.writeD16;
            goto LAB_00117fe3;
          }
        }
      }
LAB_001182df:
      local_188.base.defInf.dataPtr = (DEV_DATA *)0x0;
      local_188.base.defInf.devDef = (DEV_DEF *)0x0;
LAB_001182f0:
      uVar21 = uVar21 + 1;
      pSVar26 = (this->_devCfgs).
                super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)(((long)(this->_devCfgs).
                                     super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar26 >> 3
                              ) * -0x3333333333333333));
  }
  pCVar27 = (this->_devices).
            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar27) {
    local_90 = this->_devOpts;
    uVar21 = 0;
    do {
      pCVar25 = pCVar27 + uVar21;
      sVar17 = pCVar27[uVar21].optID;
      pPVar14 = (PLR_DEV_OPTS *)0x0;
      if (sVar17 != 0xffffffffffffffff) {
        pPVar14 = local_90 + sVar17;
      }
      p_Var8 = (pCVar27[uVar21].base.defInf.devDef)->SetLogCB;
      if (p_Var8 != (DEVFUNC_SETLOGCB)0x0) {
        (*p_Var8)((pCVar25->base).defInf.dataPtr,SndEmuLogCB,&pCVar25->logCbData);
      }
      if (pCVar27 != (pointer)0x0) {
        UVar10 = '\0';
        devInf = pCVar25;
        do {
          UVar11 = GetChipVolume(this,pCVar25->vgmChipType,pCVar25->chipID,UVar10);
          if (sVar17 == 0xffffffffffffffff) {
            UVar22 = '\0';
          }
          else {
            UVar22 = pPVar14->resmplMode;
          }
          CAA = &(devInf->base).resmpl;
          Resmpl_SetVals(CAA,UVar22,UVar11,(this->super_PlayerBase)._outSmplRate);
          Resmpl_DevConnect(CAA,(DEV_INFO *)devInf);
          Resmpl_Init(CAA);
          devInf = (pointer)(devInf->base).linkDev;
          UVar10 = UVar10 + '\x01';
        } while (devInf != (pointer)0x0);
      }
      if (pCVar25->chipType == '\t') {
        bVar5 = pCVar25->chipID;
        UVar13 = GetChipClock(this,pCVar25->vgmChipType,bVar5);
        if (pCVar27 != (pointer)0x0 && (int)UVar13 < 0) {
          do {
            if ((bVar5 & 1) == 0) {
              pIVar1 = &(pCVar25->base).resmpl.volumeL;
              *pIVar1 = *pIVar1 << 1;
              (pCVar25->base).resmpl.volumeR = 0;
            }
            else {
              (pCVar25->base).resmpl.volumeL = 0;
              pIVar1 = &(pCVar25->base).resmpl.volumeR;
              *pIVar1 = *pIVar1 << 1;
            }
            pCVar25 = (pointer)(pCVar25->base).linkDev;
          } while (pCVar25 != (pointer)0x0);
        }
      }
      uVar21 = uVar21 + 1;
      pCVar27 = (this->_devices).
                super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)(((long)(this->_devices).
                                     super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar27 >> 4
                              ) * -0x1111111111111111));
  }
  UVar11 = EstimateOverallVolume(this);
  NormalizeOverallVolume(this,UVar11);
  return;
}

Assistant:

void VGMPlayer::InitDevices(void)
{
	size_t curChip;
	
	memset(_shownCmdWarnings, 0, 0x100);
	
	_devices.clear();
	_devNames.clear();
	{
		UINT8 vgmChip;
		UINT8 chipID;
		for (vgmChip = 0x00; vgmChip < _CHIP_COUNT; vgmChip ++)
		{
			for (chipID = 0; chipID < 2; chipID ++)
				_vdDevMap[vgmChip][chipID] = (size_t)-1;
		}
	}
	for (curChip = 0; curChip < _OPT_DEV_COUNT * 2; curChip ++)
		_optDevMap[curChip] = (size_t)-1;
	
	// When the Project2612 fix is enabled [bit 7], enable it during chip init [bit 0].
	if (_p2612Fix & P2612FIX_ENABLE)
		_p2612Fix |= P2612FIX_ACTIVE;
	else
		_p2612Fix &= ~P2612FIX_ACTIVE;
	
	for (curChip = 0; curChip < _devCfgs.size(); curChip ++)
	{
		SONG_DEV_CFG& sdCfg = _devCfgs[curChip];
		UINT8 chipType = sdCfg.type;
		UINT8 chipID = sdCfg.instance;
		DEV_GEN_CFG* devCfg = (DEV_GEN_CFG*)&sdCfg.cfgData[0];
		CHIP_DEVICE chipDev;
		DEV_INFO* devInf;
		const PLR_DEV_OPTS* devOpts;
		UINT8 retVal;
		
		memset(&chipDev, 0x00, sizeof(CHIP_DEVICE));
		devInf = &chipDev.base.defInf;
		
		sdCfg.deviceID = (size_t)-1;
		chipDev.vgmChipType = sdCfg.vgmChipType;
		chipDev.chipType = sdCfg.type;
		chipDev.chipID = chipID;
		chipDev.optID = _devOptMap[chipType][chipID];
		chipDev.cfgID = curChip;
		chipDev.base.defInf.dataPtr = NULL;
		chipDev.base.linkDev = NULL;
		
		devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		switch(chipType)
		{
		case DEVID_SN76496:
			if ((chipID & 0x01) && devCfg->flags)	// must be 2nd chip + T6W28 mode
			{
				CHIP_DEVICE* otherDev = GetDevicePtr(sdCfg.vgmChipType, chipID ^ 0x01);
				if (otherDev != NULL)
				{
					SN76496_CFG* snCfg = (SN76496_CFG*)devCfg;
					// set pointer to other instance, for connecting both
					snCfg->t6w28_tone = otherDev->base.defInf.dataPtr;
					// ensure that both instances use the same core, as they are going to cross-reference each other
					snCfg->_genCfg.emuCore = otherDev->base.defInf.devDef->coreID;
				}
			}
			
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_MAME;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			break;
		case DEVID_RF5C68:
			if (! devCfg->emuCore)
			{
				if (devCfg->flags == 1)	// RF5C164
					devCfg->emuCore = FCC_GENS;
				else //if (devCfg->flags == 0)	// RF5C68
					devCfg->emuCore = FCC_MAME;
			}
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_YM2610:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'A', (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'A', (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 'B', (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 'B', (void**)&chipDev.romWriteB);
			break;
		case DEVID_YMF278B:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x524F, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x524F, (void**)&chipDev.romWrite);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0x5241, (void**)&chipDev.romSizeB);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0x5241, (void**)&chipDev.romWriteB);
			LoadOPL4ROM(&chipDev);
			break;
		case DEVID_32X_PWM:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			break;
		case DEVID_YMW258:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_C352:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_QSOUND:
			chipDev.flags = 0x00;
			{
				UINT32 hdrClock = GetChipClock(sdCfg.vgmChipType, chipID) & ~0xC0000000;
				if (hdrClock < devCfg->clock)	// QSound VGMs with old (4 MHz) clock
					chipDev.flags |= 0x01;	// enable QSound hacks (required for proper playback of old VGMs)
			}
			if (! devCfg->emuCore)
				devCfg->emuCore = FCC_CTR_;
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_QUICKWRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			
			memset(&_qsWork[chipID], 0x00, sizeof(QSOUND_WORK));
			if (devInf->devDef->coreID == FCC_MAME)
				chipDev.flags &= ~0x01;	// MAME's old HLE doesn't need those hacks
			if (chipDev.writeD16 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_A;
			else if (chipDev.write8 != NULL)
				_qsWork[chipID].write = &VGMPlayer::WriteQSound_B;
			else
				_qsWork[chipID].write = NULL;
			break;
		case DEVID_WSWAN:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			break;
		case DEVID_ES5506:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D16, 0, (void**)&chipDev.writeD16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		case DEVID_SCSP:
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D16, 0, (void**)&chipDev.writeM16);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		default:
			if (chipType == DEVID_YM2612)
				chipDev.flags |= devCfg->flags;
			else if (chipType == DEVID_C219)
				chipDev.flags |= 0x01;	// enable 16-bit byteswap patch on all ROM data
			
			retVal = SndEmu_Start(chipType, devCfg, devInf);
			if (retVal)
				break;
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&chipDev.write8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A16D8, 0, (void**)&chipDev.writeM8);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_MEMSIZE, 0, (void**)&chipDev.romSize);
			SndEmu_GetDeviceFunc(devInf->devDef, RWF_MEMORY | RWF_WRITE, DEVRW_BLOCK, 0, (void**)&chipDev.romWrite);
			break;
		}
		if (retVal)
		{
			devInf->dataPtr = NULL;
			devInf->devDef = NULL;
			continue;
		}
		sdCfg.deviceID = _devices.size();
		
		std::string devName = SndEmu_GetDevName(chipType, 0x00, devCfg);	// use short name for now
		if (GetChipCount(sdCfg.vgmChipType) > 1)
		{
			char postFix[0x10];
			snprintf(postFix, 0x10, " #%u", 1 + chipID);
			devName += postFix;
		}
		chipDev.logCbData.player = this;
		chipDev.logCbData.chipDevID = _devices.size();
		_devNames.push_back(devName);	// push here, so that we can have logs during SetupLinkedDevices()
		
		{
			DEVLINK_CB_DATA dlCbData;
			dlCbData.player = this;
			dlCbData.sdCfg = &sdCfg;
			dlCbData.chipDev = &chipDev;
			if (devInf->devDef->SetLogCB != NULL)	// allow for device link warnings
				devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
			SetupLinkedDevices(&chipDev.base, &DeviceLinkCallback, &dlCbData);
		}
		// already done by SndEmu_Start()
		//devInf->devDef->Reset(devInf->dataPtr);
		
		if (devOpts != NULL)
		{
			RefreshDevOptions(chipDev, *devOpts);
			RefreshMuting(chipDev, devOpts->muteOpts);
			RefreshPanning(chipDev, devOpts->panOpts);
		}
		if (devInf->linkDevCount > 0 && devInf->linkDevs[0].devID == DEVID_AY8910)
		{
			VGM_BASEDEV* clDev = chipDev.base.linkDev;
			size_t optID = DeviceID2OptionID(PLR_DEV_ID(DEVID_AY8910, chipID));
			if (optID != (size_t)-1 && clDev != NULL && clDev->defInf.devDef->SetOptionBits != NULL)
				clDev->defInf.devDef->SetOptionBits(devInf->dataPtr, _devOpts[optID].coreOpts);
		}

		_vdDevMap[sdCfg.vgmChipType][chipID] = _devices.size();
		if (chipDev.optID != (size_t)-1)
			_optDevMap[chipDev.optID] = _devices.size();
		_devices.push_back(chipDev);
	}	// end for (curChip)
	
	// Initializing the resampler has to be done separately due to reallocations happening above
	// and the memory address of the RESMPL_STATE mustn't change in order to allow callbacks from the devices.
	for (curChip = 0; curChip < _devices.size(); curChip ++)
	{
		CHIP_DEVICE& chipDev = _devices[curChip];
		DEV_INFO* devInf = &chipDev.base.defInf;
		const PLR_DEV_OPTS* devOpts = (chipDev.optID != (size_t)-1) ? &_devOpts[chipDev.optID] : NULL;
		VGM_BASEDEV* clDev;
		
		if (devInf->devDef->SetLogCB != NULL)
			devInf->devDef->SetLogCB(devInf->dataPtr, VGMPlayer::SndEmuLogCB, &chipDev.logCbData);
		
		UINT8 linkCntr = 0;
		for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
		{
			UINT16 chipVol = GetChipVolume(chipDev.vgmChipType, chipDev.chipID, linkCntr);
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, chipVol, _outSmplRate);
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
		
		if (chipDev.chipType == DEVID_YM3812)
		{
			if (GetChipClock(chipDev.vgmChipType, chipDev.chipID) & 0x80000000)
			{
				// Dual-OPL with Stereo - 1st chip is panned to the left, 2nd chip is panned to the right
				for (clDev = &chipDev.base; clDev != NULL; clDev = clDev->linkDev, linkCntr ++)
				{
					if (chipDev.chipID & 0x01)
					{
						clDev->resmpl.volumeL = 0x00;
						clDev->resmpl.volumeR *= 2;
					}
					else
					{
						clDev->resmpl.volumeL *= 2;
						clDev->resmpl.volumeR = 0x00;
					}
				}
			}
		}
	}
	
	NormalizeOverallVolume(EstimateOverallVolume());
	
	return;
}